

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

int run_test_poll_bad_fdtype(void)

{
  long lVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  undefined8 uVar7;
  undefined1 *puVar8;
  connection_context_t *pcVar9;
  void *pvVar10;
  ssize_t sVar11;
  ulong uVar12;
  int *piVar13;
  uint extraout_EDX;
  size_t sVar14;
  ulong unaff_RBX;
  undefined1 *puVar15;
  undefined1 *puVar16;
  sockaddr *__addr;
  void *pvVar17;
  undefined1 *puVar18;
  long *plVar19;
  long *plVar20;
  long *plVar21;
  undefined8 *__ptr;
  uv_poll_t poll_handle;
  socklen_t sStack_194;
  sockaddr sStack_190;
  code *pcStack_180;
  undefined4 uStack_16c;
  undefined1 *puStack_168;
  undefined1 *puStack_160;
  code *pcStack_158;
  undefined1 auStack_150 [160];
  code *pcStack_b0;
  undefined1 auStack_a8 [160];
  
  puVar16 = auStack_a8;
  puVar18 = (undefined1 *)0x0;
  pcStack_b0 = (code *)0x167868;
  uVar3 = open64(".",0);
  if (uVar3 == 0xffffffff) {
    pcStack_b0 = (code *)0x1678d4;
    run_test_poll_bad_fdtype_cold_4();
    puVar16 = puVar18;
LAB_001678d4:
    pcStack_b0 = (code *)0x1678d9;
    run_test_poll_bad_fdtype_cold_3();
LAB_001678d9:
    pcStack_b0 = (code *)0x1678de;
    run_test_poll_bad_fdtype_cold_1();
  }
  else {
    unaff_RBX = (ulong)uVar3;
    pcStack_b0 = (code *)0x167874;
    uVar7 = uv_default_loop();
    pcStack_b0 = (code *)0x167881;
    iVar4 = uv_poll_init(uVar7,auStack_a8,unaff_RBX);
    if (iVar4 == 0) goto LAB_001678d4;
    pcStack_b0 = (code *)0x16788c;
    iVar4 = close(uVar3);
    if (iVar4 != 0) goto LAB_001678d9;
    pcStack_b0 = (code *)0x167895;
    unaff_RBX = uv_default_loop();
    pcStack_b0 = (code *)0x1678a9;
    uv_walk(unaff_RBX,close_walk_cb,0);
    puVar16 = (undefined1 *)0x0;
    pcStack_b0 = (code *)0x1678b3;
    uv_run(unaff_RBX);
    pcStack_b0 = (code *)0x1678b8;
    uVar7 = uv_default_loop();
    pcStack_b0 = (code *)0x1678c0;
    iVar4 = uv_loop_close(uVar7);
    if (iVar4 == 0) {
      return 0;
    }
  }
  pcStack_b0 = run_test_poll_nested_epoll;
  run_test_poll_bad_fdtype_cold_2();
  puVar15 = auStack_150;
  puVar8 = auStack_150;
  puVar18 = (undefined1 *)0x1;
  pcStack_158 = (code *)0x1678f5;
  pcStack_b0 = (code *)unaff_RBX;
  uVar3 = epoll_create(1);
  if (uVar3 == 0xffffffff) {
    pcStack_158 = (code *)0x1679b8;
    run_test_poll_nested_epoll_cold_7();
LAB_001679b8:
    puVar8 = puVar18;
    pcStack_158 = (code *)0x1679bd;
    run_test_poll_nested_epoll_cold_1();
LAB_001679bd:
    pcStack_158 = (code *)0x1679c2;
    run_test_poll_nested_epoll_cold_2();
LAB_001679c2:
    pcStack_158 = (code *)0x1679c7;
    run_test_poll_nested_epoll_cold_6();
LAB_001679c7:
    pcStack_158 = (code *)0x1679cc;
    run_test_poll_nested_epoll_cold_3();
LAB_001679cc:
    pcStack_158 = (code *)0x1679d1;
    run_test_poll_nested_epoll_cold_4();
  }
  else {
    unaff_RBX = (ulong)uVar3;
    pcStack_158 = (code *)0x167905;
    puVar18 = (undefined1 *)uv_default_loop();
    pcStack_158 = (code *)0x167912;
    iVar4 = uv_poll_init(puVar18,auStack_150,unaff_RBX);
    puVar16 = puVar15;
    if (iVar4 != 0) goto LAB_001679b8;
    puVar16 = (undefined1 *)0x1;
    pcStack_158 = (code *)0x16792e;
    iVar4 = uv_poll_start(auStack_150,1,abort);
    if (iVar4 != 0) goto LAB_001679bd;
    pcStack_158 = (code *)0x16793b;
    puVar8 = (undefined1 *)uv_default_loop();
    puVar16 = (undefined1 *)0x2;
    pcStack_158 = (code *)0x167948;
    iVar4 = uv_run();
    if (iVar4 == 0) goto LAB_001679c2;
    pcStack_158 = (code *)0x167956;
    uv_close(auStack_150);
    pcStack_158 = (code *)0x16795b;
    puVar8 = (undefined1 *)uv_default_loop();
    puVar16 = (undefined1 *)0x0;
    pcStack_158 = (code *)0x167965;
    iVar4 = uv_run();
    if (iVar4 != 0) goto LAB_001679c7;
    puVar8 = (undefined1 *)(ulong)uVar3;
    pcStack_158 = (code *)0x167970;
    iVar4 = close(uVar3);
    if (iVar4 != 0) goto LAB_001679cc;
    pcStack_158 = (code *)0x167979;
    unaff_RBX = uv_default_loop();
    pcStack_158 = (code *)0x16798d;
    uv_walk(unaff_RBX,close_walk_cb,0);
    puVar16 = (undefined1 *)0x0;
    pcStack_158 = (code *)0x167997;
    uv_run(unaff_RBX);
    pcStack_158 = (code *)0x16799c;
    puVar8 = (undefined1 *)uv_default_loop();
    pcStack_158 = (code *)0x1679a4;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      return 0;
    }
  }
  pcStack_158 = create_bound_socket;
  run_test_poll_nested_epoll_cold_5();
  plVar19 = (long *)0x2;
  pcStack_180 = (code *)0x1679f6;
  puStack_168 = puVar8;
  puStack_160 = puVar16;
  pcStack_158 = (code *)unaff_RBX;
  uVar3 = socket(2,1,0);
  if ((int)uVar3 < 0) {
    pcStack_180 = (code *)0x167a44;
    create_bound_socket_cold_1();
LAB_00167a44:
    pcStack_180 = (code *)0x167a49;
    create_bound_socket_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar3;
    uStack_16c = 1;
    plVar19 = (long *)(ulong)uVar3;
    pcStack_180 = (code *)0x167a1e;
    iVar4 = setsockopt(uVar3,1,2,&uStack_16c,4);
    if (iVar4 != 0) goto LAB_00167a44;
    plVar19 = (long *)(ulong)uVar3;
    pcStack_180 = (code *)0x167a33;
    iVar4 = bind(uVar3,(sockaddr *)&puStack_168,0x10);
    if (iVar4 == 0) {
      return uVar3;
    }
  }
  pcStack_180 = server_poll_cb;
  create_bound_socket_cold_3();
  lVar1 = *plVar19;
  sStack_194 = 0x10;
  pcVar9 = (connection_context_t *)(ulong)*(uint *)(lVar1 + 0xa0);
  __addr = &sStack_190;
  pcStack_180 = (code *)unaff_RBX;
  iVar4 = accept(*(uint *)(lVar1 + 0xa0),__addr,&sStack_194);
  iVar5 = (int)__addr;
  if (iVar4 < 0) {
    server_poll_cb_cold_1();
  }
  else {
    pcVar9 = create_connection_context(iVar4,1);
    pcVar9->events = 7;
    iVar5 = 7;
    iVar4 = uv_poll_start(pcVar9,7,connection_poll_cb);
    if (iVar4 == 0) {
      iVar4 = *(int *)(lVar1 + 0xa4) + 1;
      *(int *)(lVar1 + 0xa4) = iVar4;
      if (iVar4 == 5) {
        close_socket(*(uv_os_sock_t *)(lVar1 + 0xa0));
        iVar4 = uv_close(lVar1,server_close_cb);
      }
      return iVar4;
    }
  }
  server_poll_cb_cold_2();
  plVar19 = (long *)0x170;
  iVar4 = iVar5;
  pvVar10 = malloc(0x170);
  if (pvVar10 == (void *)0x0) {
    create_connection_context_cold_3();
LAB_00167b78:
    create_connection_context_cold_1();
  }
  else {
    *(int *)((long)pvVar10 + 0x138) = (int)pcVar9;
    *(int *)((long)pvVar10 + 0x150) = iVar5;
    *(undefined8 *)((long)pvVar10 + 0x140) = 0;
    *(undefined8 *)((long)pvVar10 + 0x148) = 0;
    *(undefined8 *)((long)pvVar10 + 0x154) = 0;
    *(undefined8 *)((long)pvVar10 + 0x15c) = 0;
    *(undefined8 *)((long)pvVar10 + 0x164) = 0;
    plVar19 = (long *)uv_default_loop();
    pvVar17 = pvVar10;
    iVar5 = uv_poll_init_socket(plVar19,pvVar10,(ulong)pcVar9 & 0xffffffff);
    iVar4 = (int)pvVar17;
    *(int *)((long)pvVar10 + 0x154) = *(int *)((long)pvVar10 + 0x154) + 1;
    *(void **)pvVar10 = pvVar10;
    if (iVar5 != 0) goto LAB_00167b78;
    plVar19 = (long *)uv_default_loop();
    iVar4 = (int)pvVar10 + 0xa0;
    iVar5 = uv_timer_init();
    *(int *)((long)pvVar10 + 0x154) = *(int *)((long)pvVar10 + 0x154) + 1;
    *(void **)((long)pvVar10 + 0xa0) = pvVar10;
    if (iVar5 == 0) {
      return (int)pvVar10;
    }
  }
  create_connection_context_cold_2();
  plVar20 = plVar19;
  if (iVar4 == 0) {
    plVar2 = (long *)*plVar19;
    uVar3 = *(uint *)((long)plVar2 + 0x164);
    if ((uVar3 & extraout_EDX) == 0) goto LAB_00168090;
    if ((~uVar3 & extraout_EDX) != 0) goto LAB_00168095;
    if ((extraout_EDX & 1) == 0) goto switchD_00167c05_caseD_4;
    iVar4 = rand();
    switch(iVar4 % 7) {
    case 0:
    case 1:
      plVar20 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
      sVar11 = recv(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer,0x4a,0);
      uVar6 = (uint)sVar11;
      if (-1 < (int)uVar6) {
        if (uVar6 == 0) goto LAB_00167caa;
        plVar2[0x28] = plVar2[0x28] + (ulong)(uVar6 & 0x7fffffff);
        break;
      }
      goto LAB_001680a4;
    case 2:
    case 3:
      plVar20 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
      uVar12 = recv(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_1,0x3a3,0);
      if (-1 < (int)uVar12) {
        if ((int)uVar12 != 0) {
          do {
            plVar2[0x28] = plVar2[0x28] + (uVar12 & 0xffffffff);
            plVar20 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
            uVar12 = recv(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_1,0x3a3,0);
          } while (0 < (int)uVar12);
          if ((int)uVar12 != 0) {
            piVar13 = __errno_location();
            if ((*piVar13 == 0xb) || (*piVar13 == 0x73)) break;
            connection_poll_cb_cold_4();
          }
        }
LAB_00167caa:
        *(undefined4 *)(plVar2 + 0x2b) = 1;
        uVar3 = uVar3 & 0xfffffffe;
        break;
      }
      goto LAB_001680a9;
    case 4:
      break;
    case 5:
      uVar3 = uVar3 & 0xfffffffe;
      plVar20 = plVar2 + 0x14;
      plVar21 = plVar20;
      iVar4 = uv_is_active();
      if (iVar4 == 0) {
        *(undefined4 *)(plVar2 + 0x2d) = 1;
        uv_timer_start(plVar20,delay_timer_cb,10,0);
      }
      else {
        *(byte *)(plVar2 + 0x2d) = *(byte *)(plVar2 + 0x2d) | 1;
        plVar20 = plVar21;
      }
      break;
    case 6:
      uv_poll_start(plVar2,2,connection_poll_cb);
      plVar20 = plVar2;
      uv_poll_start(plVar2,1,connection_poll_cb);
      *(undefined4 *)((long)plVar2 + 0x164) = 1;
      break;
    default:
      goto switchD_00167c05_default;
    }
switchD_00167c05_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_00167e8c_caseD_4;
    if (((ulong)plVar2[0x29] < 0x10000) && ((test_mode != '\x01' || (*(int *)(plVar2 + 0x2a) == 0)))
       ) {
      iVar4 = rand();
      switch(iVar4 % 7) {
      case 0:
      case 1:
        if (plVar2[0x29] == 0x10000) goto LAB_001680b3;
        uVar12 = 0x10000 - plVar2[0x29];
        sVar14 = 0x67;
        if (uVar12 < 0x67) {
          sVar14 = uVar12;
        }
        plVar20 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
        sVar11 = send(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_2,sVar14,0);
        uVar6 = (uint)sVar11;
        if ((int)uVar6 < 0) {
          piVar13 = __errno_location();
          if ((*piVar13 != 0xb) && (*piVar13 != 0x73)) {
            connection_poll_cb_cold_13();
            goto LAB_00168027;
          }
LAB_0016803c:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        if (uVar6 != 0) {
          plVar2[0x29] = plVar2[0x29] + (ulong)(uVar6 & 0x7fffffff);
          valid_writable_wakeups = valid_writable_wakeups + 1;
          break;
        }
        goto LAB_001680bd;
      case 2:
      case 3:
        if (plVar2[0x29] == 0x10000) goto LAB_001680b8;
        sVar14 = 0x10000 - plVar2[0x29];
        if (0x4d1 < sVar14) {
          sVar14 = 0x4d2;
        }
        plVar20 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
        sVar11 = send(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_3,sVar14,0);
        uVar6 = (uint)sVar11;
        if (-1 < (int)uVar6) {
          if (uVar6 != 0) {
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar12 = (ulong)(uVar6 & 0x7fffffff) + plVar2[0x29];
            plVar2[0x29] = uVar12;
            while (uVar12 < 0x10000) {
              sVar14 = 0x10000 - uVar12;
              if (uVar12 < 0xfb2f) {
                sVar14 = 0x4d2;
              }
              plVar20 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
              sVar11 = send(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_3,sVar14,0);
              if ((int)(uint)sVar11 < 1) {
                piVar13 = __errno_location();
                if ((*piVar13 != 0xb) && (*piVar13 != 0x73)) {
                  connection_poll_cb_cold_8();
                  goto LAB_0016808b;
                }
                break;
              }
              uVar12 = (ulong)((uint)sVar11 & 0x7fffffff) + plVar2[0x29];
              plVar2[0x29] = uVar12;
            }
            break;
          }
          goto LAB_001680c2;
        }
LAB_00168027:
        piVar13 = __errno_location();
        if ((*piVar13 == 0xb) || (*piVar13 == 0x73)) goto LAB_0016803c;
        goto LAB_001680cc;
      case 4:
        break;
      case 5:
        uVar3 = uVar3 & 0xfffffffd;
        iVar4 = uv_is_active(plVar2 + 0x14);
        if (iVar4 == 0) {
          *(undefined4 *)(plVar2 + 0x2d) = 2;
          uv_timer_start(plVar2 + 0x14,delay_timer_cb,100,0);
        }
        else {
          *(byte *)(plVar2 + 0x2d) = *(byte *)(plVar2 + 0x2d) | 2;
        }
        break;
      case 6:
        uv_poll_start(plVar2,1,connection_poll_cb);
        uv_poll_start(plVar2,2,connection_poll_cb);
        *(undefined4 *)((long)plVar2 + 0x164) = 2;
        break;
      default:
        goto switchD_00167e8c_default;
      }
switchD_00167e8c_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)(plVar2 + 0x2c) = 1;
        disconnects = disconnects + 1;
        uVar3 = uVar3 & 0xfffffffb;
      }
      if (((*(int *)(plVar2 + 0x2b) == 0) || (*(int *)((long)plVar2 + 0x15c) == 0)) ||
         (*(int *)(plVar2 + 0x2c) == 0)) {
        if (uVar3 != *(uint *)((long)plVar2 + 0x164)) {
          *(uint *)((long)plVar2 + 0x164) = uVar3;
          uv_poll_start(plVar19,uVar3,connection_poll_cb);
        }
      }
      else {
        close_socket(*(uv_os_sock_t *)(plVar2 + 0x27));
        uv_close(plVar2,connection_close_cb);
        uv_close(plVar2 + 0x14,connection_close_cb);
        *(undefined4 *)((long)plVar2 + 0x164) = 0;
      }
      iVar4 = *(int *)((long)plVar2 + 0x164);
      iVar5 = uv_is_active();
      if (iVar4 != 0) {
        if (iVar5 == 1) {
          return 1;
        }
        connection_poll_cb_cold_16();
        iVar5 = extraout_EAX;
      }
      if (iVar5 == 0) {
        return 0;
      }
      goto LAB_0016809a;
    }
    plVar20 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
    iVar4 = shutdown(*(uint *)(plVar2 + 0x27),1);
    if (iVar4 == 0) {
      *(undefined4 *)((long)plVar2 + 0x15c) = 1;
      uVar3 = uVar3 & 0xfffffffd;
      goto switchD_00167e8c_caseD_4;
    }
  }
  else {
LAB_0016808b:
    connection_poll_cb_cold_1();
    plVar19 = plVar20;
LAB_00168090:
    connection_poll_cb_cold_18();
LAB_00168095:
    connection_poll_cb_cold_2();
LAB_0016809a:
    connection_poll_cb_cold_17();
    plVar20 = plVar19;
  }
  connection_poll_cb_cold_7();
LAB_001680a4:
  connection_poll_cb_cold_5();
LAB_001680a9:
  connection_poll_cb_cold_3();
switchD_00167c05_default:
  connection_poll_cb_cold_6();
LAB_001680b3:
  connection_poll_cb_cold_14();
LAB_001680b8:
  connection_poll_cb_cold_11();
LAB_001680bd:
  connection_poll_cb_cold_12();
LAB_001680c2:
  connection_poll_cb_cold_9();
switchD_00167e8c_default:
  connection_poll_cb_cold_15();
LAB_001680cc:
  connection_poll_cb_cold_10();
  iVar4 = close((int)plVar20);
  if ((iVar4 == 0) || (piVar13 = __errno_location(), *piVar13 == 0x68)) {
    return extraout_EAX_00;
  }
  close_socket_cold_1();
  plVar19 = (long *)*plVar20;
  iVar4 = uv_is_active();
  if (iVar4 == 0) {
    if (*(uint *)(plVar19 + 0x2d) == 0) goto LAB_00168133;
    uVar3 = *(uint *)(plVar19 + 0x2d) | *(uint *)((long)plVar19 + 0x164);
    *(uint *)((long)plVar19 + 0x164) = uVar3;
    *(undefined4 *)(plVar19 + 0x2d) = 0;
    iVar4 = uv_poll_start(plVar19,uVar3,connection_poll_cb);
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_00168133:
    plVar19 = plVar20;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  __ptr = (undefined8 *)*plVar19;
  piVar13 = (int *)((long)__ptr + 0x154);
  *piVar13 = *piVar13 + -1;
  if (*piVar13 != 0) {
    return extraout_EAX_01;
  }
  if ((test_mode == '\x01') && (*(int *)(__ptr + 0x2a) == 0)) {
    if (__ptr[0x28] != 0) {
      connection_close_cb_cold_2();
LAB_001681af:
      connection_close_cb_cold_1();
      goto LAB_001681b4;
    }
  }
  else if (__ptr[0x28] != 0x10000) goto LAB_001681af;
  if ((test_mode != '\0') && (*(int *)(__ptr + 0x2a) != 0)) {
    if (__ptr[0x29] == 0) goto LAB_00168194;
    connection_close_cb_cold_3();
  }
  if (__ptr[0x29] != 0x10000) {
LAB_001681b4:
    connection_close_cb_cold_4();
    free((void *)*__ptr);
    return extraout_EAX_03;
  }
LAB_00168194:
  closed_connections = closed_connections + 1;
  free(__ptr);
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(poll_bad_fdtype) {
#if !defined(__DragonFly__) && !defined(__FreeBSD__) && !defined(__sun) && \
    !defined(_AIX) && !defined(__MVS__) && !defined(__FreeBSD_kernel__) && \
    !defined(__OpenBSD__) && !defined(__CYGWIN__) && !defined(__MSYS__) && \
    !defined(__NetBSD__)
  uv_poll_t poll_handle;
  int fd;

#if defined(_WIN32)
  fd = open("test/fixtures/empty_file", O_RDONLY);
#else
  fd = open(".", O_RDONLY);
#endif
  ASSERT(fd != -1);
  ASSERT(0 != uv_poll_init(uv_default_loop(), &poll_handle, fd));
  ASSERT(0 == close(fd));
#endif

  MAKE_VALGRIND_HAPPY();
  return 0;
}